

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

int __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::open
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,char *__file,int __oflag,...)

{
  CharProperty *this_00;
  pointer ppDVar1;
  pointer ppVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  Dictionary *pDVar7;
  ostream *poVar8;
  char *pcVar9;
  char **out;
  size_t sVar10;
  mecab_dictionary_info_t *pmVar11;
  unsigned_long uVar12;
  uint uVar13;
  unsigned_long uVar14;
  int __oflag_00;
  size_t sVar15;
  ulong uVar16;
  result_type rVar17;
  string tmp;
  Dictionary *sysdic;
  string userdic;
  Dictionary *d;
  scoped_fixed_array<char_*,_8192> dicfile;
  wlog local_60;
  vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *local_58;
  string prefix;
  
  close(this,(int)__file);
  Param::get<std::__cxx11::string>(&prefix,(Param *)__file,"dicdir");
  std::__cxx11::string::string((string *)&tmp,"unk.dic",(allocator *)&dicfile);
  create_filename(&userdic,&prefix,&tmp);
  iVar6 = Dictionary::open(&this->unkdic_,userdic._M_dataplus._M_p,0x183d26);
  std::__cxx11::string::~string((string *)&userdic);
  std::__cxx11::string::~string((string *)&tmp);
  if ((char)iVar6 == '\0') {
    wlog::wlog((wlog *)&userdic,&this->what_);
    poVar8 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                            );
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x67);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"unkdic_.open(create_filename (prefix, UNK_DIC_FILE).c_str())");
    poVar8 = std::operator<<(poVar8,"] ");
    pcVar9 = whatlog::str(&(this->unkdic_).what_);
    std::operator<<(poVar8,pcVar9);
  }
  else {
    this_00 = &this->property_;
    iVar6 = CharProperty::open(this_00,__file,__oflag_00);
    if ((char)iVar6 == '\0') {
      wlog::wlog((wlog *)&userdic,&this->what_);
      poVar8 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                              );
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x69);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"property_.open(param)");
      poVar8 = std::operator<<(poVar8,"] ");
      pcVar9 = whatlog::str(&(this->property_).what_);
      std::operator<<(poVar8,pcVar9);
    }
    else {
      pDVar7 = (Dictionary *)operator_new(0x260);
      Dictionary::Dictionary(pDVar7);
      sysdic = pDVar7;
      std::__cxx11::string::string((string *)&tmp,"sys.dic",(allocator *)&dicfile);
      create_filename(&userdic,&prefix,&tmp);
      iVar6 = Dictionary::open(pDVar7,userdic._M_dataplus._M_p,0x183d26);
      std::__cxx11::string::~string((string *)&userdic);
      std::__cxx11::string::~string((string *)&tmp);
      if ((char)iVar6 == '\0') {
        wlog::wlog((wlog *)&userdic,&this->what_);
        poVar8 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                );
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x6e);
        poVar8 = std::operator<<(poVar8,") [");
        poVar8 = std::operator<<(poVar8,
                                 "sysdic->open (create_filename(prefix, SYS_DIC_FILE).c_str())");
        poVar8 = std::operator<<(poVar8,"] ");
        pcVar9 = whatlog::str(&sysdic->what_);
        std::operator<<(poVar8,pcVar9);
      }
      else {
        if (sysdic->type_ == 0) {
          CharProperty::set_charset(this_00,sysdic->charset_);
          local_58 = &this->dic_;
          std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::push_back
                    (local_58,&sysdic);
          Param::get<std::__cxx11::string>(&userdic,(Param *)__file,"userdic");
          if (userdic._M_string_length != 0) {
            tmp._M_dataplus._M_p = "B(\x15";
            pcVar9 = (char *)operator_new__(0x2000);
            tmp.field_2._M_allocated_capacity = 0x2000;
            dicfile._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019ef10;
            tmp._M_string_length = (size_type)pcVar9;
            out = (char **)operator_new__(0x10000);
            dicfile.size_ = 0x2000;
            dicfile.ptr_ = out;
            strncpy(pcVar9,userdic._M_dataplus._M_p,0x2000);
            sVar10 = tokenizeCSV<char**>(pcVar9,out,0x2000);
            for (sVar15 = 0; sVar10 != sVar15; sVar15 = sVar15 + 1) {
              pDVar7 = (Dictionary *)operator_new(0x260);
              Dictionary::Dictionary(pDVar7);
              d = pDVar7;
              iVar6 = Dictionary::open(pDVar7,dicfile.ptr_[sVar15],0x183d26);
              if ((char)iVar6 == '\0') {
                wlog::wlog(&local_60,&this->what_);
                poVar8 = std::operator<<((ostream *)&this->what_,
                                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                        );
                poVar8 = std::operator<<(poVar8,"(");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x7f);
                poVar8 = std::operator<<(poVar8,") [");
                poVar8 = std::operator<<(poVar8,"d->open(dicfile[i])");
                poVar8 = std::operator<<(poVar8,"] ");
                pcVar9 = whatlog::str(&d->what_);
                std::operator<<(poVar8,pcVar9);
LAB_0015798c:
                scoped_fixed_array<char_*,_8192>::~scoped_fixed_array(&dicfile);
                scoped_fixed_array<char,_8192>::~scoped_fixed_array
                          ((scoped_fixed_array<char,_8192> *)&tmp);
                goto LAB_001579a0;
              }
              if (d->type_ != 1) {
                wlog::wlog(&local_60,&this->what_);
                poVar8 = std::operator<<((ostream *)&this->what_,
                                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                        );
                poVar8 = std::operator<<(poVar8,"(");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x80);
                poVar8 = std::operator<<(poVar8,") [");
                poVar8 = std::operator<<(poVar8,"d->type() == 1");
                poVar8 = std::operator<<(poVar8,"] ");
                poVar8 = std::operator<<(poVar8,"not a user dictionary: ");
                std::operator<<(poVar8,dicfile.ptr_[sVar15]);
                goto LAB_0015798c;
              }
              bVar5 = Dictionary::isCompatible(sysdic,d);
              if (!bVar5) {
                wlog::wlog(&local_60,&this->what_);
                poVar8 = std::operator<<((ostream *)&this->what_,
                                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                        );
                poVar8 = std::operator<<(poVar8,"(");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x82);
                poVar8 = std::operator<<(poVar8,") [");
                poVar8 = std::operator<<(poVar8,"sysdic->isCompatible(*d)");
                poVar8 = std::operator<<(poVar8,"] ");
                poVar8 = std::operator<<(poVar8,"incompatible dictionary: ");
                std::operator<<(poVar8,dicfile.ptr_[sVar15]);
                goto LAB_0015798c;
              }
              std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::push_back
                        (local_58,&d);
            }
            scoped_fixed_array<char_*,_8192>::~scoped_fixed_array(&dicfile);
            scoped_fixed_array<char,_8192>::~scoped_fixed_array
                      ((scoped_fixed_array<char,_8192> *)&tmp);
          }
          this->dictionary_info_ = (DictionaryInfo *)0x0;
          (this->dictionary_info_freelist_).pi_ = 0;
          (this->dictionary_info_freelist_).li_ = 0;
          uVar16 = (ulong)((long)(this->dic_).
                                 super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->dic_).
                                super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
          while( true ) {
            uVar16 = uVar16 - 1;
            if ((int)(uint)uVar16 < 0) break;
            pmVar11 = FreeList<mecab_dictionary_info_t>::alloc(&this->dictionary_info_freelist_);
            pmVar11->next = this->dictionary_info_;
            uVar13 = (uint)uVar16 & 0x7fffffff;
            ppDVar1 = (this->dic_).
                      super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pmVar11->filename = (ppDVar1[uVar13]->filename_)._M_dataplus._M_p;
            pmVar11->charset = ppDVar1[uVar13]->charset_;
            pDVar7 = ppDVar1[uVar13];
            uVar13 = pDVar7->type_;
            uVar3 = pDVar7->lsize_;
            uVar4 = pDVar7->rsize_;
            pmVar11->size = pDVar7->lexsize_;
            pmVar11->type = uVar13;
            pmVar11->lsize = uVar3;
            pmVar11->rsize = uVar4;
            pmVar11->version = (unsigned_short)pDVar7->version_;
            this->dictionary_info_ = pmVar11;
          }
          ppVar2 = (this->unk_tokens_).
                   super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->unk_tokens_).
              super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
            (this->unk_tokens_).
            super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
          }
          uVar16 = 0;
LAB_00157644:
          sVar10 = CharProperty::size(this_00);
          if (uVar16 < sVar10) {
            pcVar9 = CharProperty::name(this_00,uVar16);
            rVar17 = Dictionary::exactMatchSearch(&this->unkdic_,pcVar9);
            if (rVar17.value != -1) goto code_r0x00157673;
            wlog::wlog((wlog *)&tmp,&this->what_);
            poVar8 = std::operator<<((ostream *)&this->what_,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,"(");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x9b);
            poVar8 = std::operator<<(poVar8,") [");
            poVar8 = std::operator<<(poVar8,"n.value != -1");
            poVar8 = std::operator<<(poVar8,"] ");
            poVar8 = std::operator<<(poVar8,"cannot find UNK category: ");
            std::operator<<(poVar8,pcVar9);
LAB_001579a0:
            iVar6 = 0;
          }
          else {
            this->space_ = (this->property_).map_[0x20];
            Param::get<std::__cxx11::string>(&tmp,(Param *)__file,"bos-feature");
            scoped_string::reset_string(&this->bos_feature_,&tmp);
            std::__cxx11::string::~string((string *)&tmp);
            Param::get<std::__cxx11::string>(&tmp,(Param *)__file,"unk-feature");
            scoped_array<char>::reset(&(this->unk_feature_).super_scoped_array<char>,(char *)0x0);
            if (tmp._M_string_length != 0) {
              scoped_string::reset_string(&this->unk_feature_,&tmp);
            }
            bVar5 = *(this->bos_feature_).super_scoped_array<char>.ptr_ == '\0';
            iVar6 = (int)CONCAT71((int7)(uVar16 >> 8),!bVar5);
            if (bVar5) {
              wlog::wlog((wlog *)&dicfile,&this->what_);
              poVar8 = std::operator<<((ostream *)&this->what_,
                                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                      );
              poVar8 = std::operator<<(poVar8,"(");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xab);
              poVar8 = std::operator<<(poVar8,") [");
              poVar8 = std::operator<<(poVar8,"*bos_feature_ != \'\\0\'");
              poVar8 = std::operator<<(poVar8,"] ");
              std::operator<<(poVar8,"bos-feature is undefined in dicrc");
            }
            else {
              uVar12 = Param::get<unsigned_long>((Param *)__file,"max-grouping-size");
              uVar14 = 0x18;
              if (uVar12 != 0) {
                uVar14 = uVar12;
              }
              this->max_grouping_size_ = uVar14;
            }
            std::__cxx11::string::~string((string *)&tmp);
          }
          std::__cxx11::string::~string((string *)&userdic);
          goto LAB_00157426;
        }
        wlog::wlog((wlog *)&userdic,&this->what_);
        poVar8 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                );
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x71);
        poVar8 = std::operator<<(poVar8,") [");
        poVar8 = std::operator<<(poVar8,"sysdic->type() == 0");
        poVar8 = std::operator<<(poVar8,"] ");
        poVar8 = std::operator<<(poVar8,"not a system dictionary: ");
        std::operator<<(poVar8,(string *)&prefix);
      }
    }
  }
  iVar6 = 0;
LAB_00157426:
  std::__cxx11::string::~string((string *)&prefix);
  return iVar6;
code_r0x00157673:
  tmp._M_dataplus._M_p = (pointer)((this->unkdic_).token_ + (rVar17.value >> 8));
  tmp._M_string_length = (size_type)(byte)rVar17.value;
  std::
  vector<std::pair<MeCab::Token_const*,unsigned_long>,std::allocator<std::pair<MeCab::Token_const*,unsigned_long>>>
  ::emplace_back<std::pair<MeCab::Token_const*,unsigned_long>>
            ((vector<std::pair<MeCab::Token_const*,unsigned_long>,std::allocator<std::pair<MeCab::Token_const*,unsigned_long>>>
              *)&this->unk_tokens_,(pair<const_MeCab::Token_*,_unsigned_long> *)&tmp);
  uVar16 = uVar16 + 1;
  goto LAB_00157644;
}

Assistant:

bool Tokenizer<N, P>::open(const Param &param) {
  close();

  const std::string prefix = param.template get<std::string>("dicdir");

  CHECK_FALSE(unkdic_.open(create_filename
                                 (prefix, UNK_DIC_FILE).c_str()))
      << unkdic_.what();
  CHECK_FALSE(property_.open(param)) << property_.what();

  Dictionary *sysdic = new Dictionary;

  CHECK_FALSE(sysdic->open
                    (create_filename(prefix, SYS_DIC_FILE).c_str()))
      << sysdic->what();

  CHECK_FALSE(sysdic->type() == 0)
      << "not a system dictionary: " << prefix;

  property_.set_charset(sysdic->charset());
  dic_.push_back(sysdic);

  const std::string userdic = param.template get<std::string>("userdic");
  if (!userdic.empty()) {
    scoped_fixed_array<char, BUF_SIZE> buf;
    scoped_fixed_array<char *, BUF_SIZE> dicfile;
    std::strncpy(buf.get(), userdic.c_str(), buf.size());
    const size_t n = tokenizeCSV(buf.get(), dicfile.get(), dicfile.size());
    for (size_t i = 0; i < n; ++i) {
      Dictionary *d = new Dictionary;
      CHECK_FALSE(d->open(dicfile[i])) << d->what();
      CHECK_FALSE(d->type() == 1)
          << "not a user dictionary: " << dicfile[i];
      CHECK_FALSE(sysdic->isCompatible(*d))
          << "incompatible dictionary: " << dicfile[i];
      dic_.push_back(d);
    }
  }

  dictionary_info_ = 0;
  dictionary_info_freelist_.free();
  for (int i = static_cast<int>(dic_.size() - 1); i >= 0; --i) {
    DictionaryInfo *d = dictionary_info_freelist_.alloc();
    d->next          = dictionary_info_;
    d->filename      = dic_[i]->filename();
    d->charset       = dic_[i]->charset();
    d->size          = dic_[i]->size();
    d->lsize         = dic_[i]->lsize();
    d->rsize         = dic_[i]->rsize();
    d->type          = dic_[i]->type();
    d->version       = dic_[i]->version();
    dictionary_info_ = d;
  }

  unk_tokens_.clear();
  for (size_t i = 0; i < property_.size(); ++i) {
    const char *key = property_.name(i);
    const Dictionary::result_type n = unkdic_.exactMatchSearch(key);
    CHECK_FALSE(n.value != -1) << "cannot find UNK category: " << key;
    const Token *token = unkdic_.token(n);
    size_t size = unkdic_.token_size(n);
    unk_tokens_.push_back(std::make_pair(token, size));
  }

  space_ = property_.getCharInfo(0x20);  // ad-hoc

  bos_feature_.reset_string(param.template get<std::string>("bos-feature"));

  const std::string tmp = param.template get<std::string>("unk-feature");
  unk_feature_.reset(0);
  if (!tmp.empty()) {
    unk_feature_.reset_string(tmp);
  }

  CHECK_FALSE(*bos_feature_ != '\0')
      << "bos-feature is undefined in dicrc";

  max_grouping_size_ = param.template get<size_t>("max-grouping-size");
  if (max_grouping_size_ == 0) {
    max_grouping_size_ = DEFAULT_MAX_GROUPING_SIZE;
  }

  return true;
}